

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastPower(Gia_Man_t *pNew,int *pNum,int nNum,int *pExp,int nExp,Vec_Int_t *vTemp,
                   Vec_Int_t *vRes)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int *pArg0;
  int *pArray;
  int *pResTemp;
  int k;
  int *pRes;
  int *pDegrees;
  int i;
  Vec_Int_t *vResTemp;
  Vec_Int_t *vDegrees;
  Vec_Int_t *vTemp_local;
  int nExp_local;
  int *pExp_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  p = Vec_IntAlloc(nNum << 1);
  p_00 = Vec_IntAlloc(nNum << 1);
  pRes = (int *)0x0;
  pArg0 = Vec_IntArray(vRes);
  pArray = Vec_IntArray(p_00);
  Vec_IntFill(vRes,nNum,0);
  Vec_IntWriteEntry(vRes,0,1);
  for (pDegrees._4_4_ = 0; pDegrees._4_4_ < nExp; pDegrees._4_4_ = pDegrees._4_4_ + 1) {
    if (pDegrees._4_4_ == 0) {
      pRes = Wlc_VecCopy(p,pNum,nNum);
    }
    else {
      Wlc_BlastMultiplier2(pNew,pRes,pRes,nNum,vTemp,p_00);
      pRes = Wlc_VecCopy(p,pArray,nNum);
    }
    Wlc_BlastMultiplier2(pNew,pArg0,pRes,nNum,vTemp,p_00);
    for (pResTemp._4_4_ = 0; pResTemp._4_4_ < nNum; pResTemp._4_4_ = pResTemp._4_4_ + 1) {
      iVar1 = Gia_ManHashMux(pNew,pExp[pDegrees._4_4_],pArray[pResTemp._4_4_],pArg0[pResTemp._4_4_])
      ;
      pArg0[pResTemp._4_4_] = iVar1;
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p);
  return;
}

Assistant:

void Wlc_BlastPower( Gia_Man_t * pNew, int * pNum, int nNum, int * pExp, int nExp, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    Vec_Int_t * vDegrees = Vec_IntAlloc( 2*nNum );
    Vec_Int_t * vResTemp = Vec_IntAlloc( 2*nNum );
    int i, * pDegrees = NULL, * pRes = Vec_IntArray(vRes);
    int k, * pResTemp = Vec_IntArray(vResTemp);
    Vec_IntFill( vRes, nNum, 0 );
    Vec_IntWriteEntry( vRes, 0, 1 );
    for ( i = 0; i < nExp; i++ )
    {
        if ( i == 0 )
            pDegrees = Wlc_VecCopy( vDegrees, pNum, nNum );
        else
        {
            Wlc_BlastMultiplier2( pNew, pDegrees, pDegrees, nNum, vTemp, vResTemp );
            pDegrees = Wlc_VecCopy( vDegrees, pResTemp, nNum );
        }
        Wlc_BlastMultiplier2( pNew, pRes, pDegrees, nNum, vTemp, vResTemp );
        for ( k = 0; k < nNum; k++ )
            pRes[k] = Gia_ManHashMux( pNew, pExp[i], pResTemp[k], pRes[k] );
    }
    Vec_IntFree( vResTemp );
    Vec_IntFree( vDegrees );
}